

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_ExtractAndInsertNodeHandleSet_Test::TestBody
          (Btree_ExtractAndInsertNodeHandleSet_Test *this)

{
  undefined1 auVar1 [8];
  _Alloc_hider _Var2;
  pointer *__ptr_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar3;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  iterator iVar4;
  iterator position;
  iterator position_00;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  node_type nh;
  insert_return_type res;
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_> src2;
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_> other;
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_> src1;
  AssertHelper local_c8;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  undefined1 local_b0 [4];
  aligned_storage_t<sizeof(slot_type),_alignof(slot_type)> aStack_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  node_type local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  undefined1 local_78 [5];
  bool local_73;
  aligned_storage_t<sizeof(slot_type),_alignof(slot_type)> local_70 [4];
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  AssertHelper local_48;
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_> local_40;
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_> local_28;
  
  local_88 = (undefined1  [8])&DAT_200000001;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_400000003;
  local_78._0_4_ = 5;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>>
  ::btree_set_container<int_const*>
            ((btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>>
              *)&local_28,(int *)local_88,(int *)(local_78 + 4),(key_compare *)local_b0,
             (allocator_type *)&local_40);
  local_88._0_4_ = 3;
  iVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          find<int>(&local_28,(int *)local_88);
  position._8_8_ = iVar4._8_8_ & 0xffffffff;
  position.node = iVar4.node;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::extract(&local_90,
            (btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
             *)&local_28,position);
  _local_b0 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000005
  ;
  pbStack_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000002;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
  ::operator()(local_88,local_b0,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"src1");
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)local_b0);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x720,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)_local_b0 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_40.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
        )&btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
          EmptyNode()::empty_node;
  local_40.rightmost_ =
       (node_type *)
       &btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
        EmptyNode()::empty_node;
  local_40.size_ = 0;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::insert((insert_return_type *)local_88,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
            *)&local_40,&local_90);
  local_60._0_4_ = 3;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_b0,local_60,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"other");
  if (local_b0[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_60);
    if (pbStack_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x723,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_60 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_60 + 8))();
    }
  }
  if (pbStack_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a8,pbStack_a8);
  }
  local_c0._0_4_ = 3;
  iVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          find<int>(&local_40,(int *)local_c0);
  local_60 = (undefined1  [8])iVar4.node;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_58._4_4_,iVar4.position);
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>>
            ((internal *)local_b0,"res.position","other.find(3)",
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)local_88,
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)local_60);
  if (local_b0[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_60);
    if (pbStack_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x724,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_60 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_60 + 8))();
    }
  }
  if (pbStack_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a8,pbStack_a8);
  }
  local_60[0] = local_78[0];
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)local_60,(AssertionResult *)"res.inserted","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x725,(char *)_local_b0);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b0 != &local_a0) {
      operator_delete(_local_b0,
                      CONCAT26(local_a0._M_allocated_capacity._6_2_,
                               CONCAT15(local_a0._M_local_buf[5],
                                        CONCAT41(local_a0._M_allocated_capacity._1_4_,
                                                 local_a0._M_local_buf[0]))) + 1);
    }
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_60 = (undefined1  [8])(CONCAT71(local_60._1_7_,local_73) ^ 1);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_73 == true) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)local_60,(AssertionResult *)"res.node.empty()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x726,(char *)_local_b0);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b0 != &local_a0) {
      operator_delete(_local_b0,
                      CONCAT26(local_a0._M_allocated_capacity._6_2_,
                               CONCAT15(local_a0._M_local_buf[5],
                                        CONCAT41(local_a0._M_allocated_capacity._1_4_,
                                                 local_a0._M_local_buf[0]))) + 1);
    }
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  _local_b0 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &DAT_400000003;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>>
  ::btree_set_container<int_const*>
            ((btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>>
              *)local_60,(int *)local_b0,(int *)&pbStack_a8,(key_compare *)local_c0,
             (allocator_type *)&local_c8);
  local_c0._0_4_ = 3;
  iVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          find<int>((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                     *)local_60,(int *)local_c0);
  position_00._8_8_ = iVar4._8_8_ & 0xffffffff;
  position_00.node = iVar4.node;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::extract((node_type *)local_b0,
            (btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
             *)local_60,position_00);
  _Var2._M_p = (pointer)_local_b0;
  if (local_90.
      super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == true) {
    local_90.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
  }
  if ((bool)local_b0[1] == true) {
    local_90.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = true;
    local_90.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .slot_space_.data[0] = aStack_ac.data[0];
    local_90.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .slot_space_.data[1] = aStack_ac.data[1];
    local_90.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .slot_space_.data[2] = aStack_ac.data[2];
    local_90.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .slot_space_.data[3] = aStack_ac.data[3];
    stack0xffffffffffffff52 = SUB86(_Var2._M_p,2);
    local_b0[0] = SUB81(_Var2._M_p,0);
    local_b0[1] = 0;
  }
  if ((bool)local_b0[1] == true) {
    local_b0[1] = 0;
  }
  if ((bool)local_b0[1] == true) {
    local_b0[1] = 0;
  }
  local_c0._0_4_ = 4;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_b0,local_c0,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"src2");
  if (local_b0[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (pbStack_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (pbStack_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a8,pbStack_a8);
  }
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::insert((insert_return_type *)local_b0,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
            *)&local_40,&local_90);
  local_78[0] = local_a0._M_local_buf[0];
  local_88 = (undefined1  [8])_local_b0;
  pbStack_80 = pbStack_a8;
  if (local_73 == true) {
    local_73 = false;
  }
  if (local_a0._M_local_buf[5] == '\x01') {
    local_73 = true;
    local_70[0].data[0] = local_a0._M_local_buf[8];
    local_70[0].data[1] = local_a0._M_local_buf[9];
    local_70[0].data[2] = local_a0._M_local_buf[10];
    local_70[0].data[3] = local_a0._M_local_buf[0xb];
    local_a0._M_local_buf[5] = '\0';
  }
  if (local_a0._M_local_buf[5] == '\x01') {
    local_a0._M_local_buf[5] = '\0';
  }
  if (local_a0._M_local_buf[5] == '\x01') {
    local_a0._M_local_buf[5] = '\0';
  }
  local_c0._0_4_ = 3;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_b0,local_c0,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"other");
  if (local_b0[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (pbStack_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (pbStack_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a8,pbStack_a8);
  }
  local_c8.data_._0_4_ = 3;
  iVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          find<int>(&local_40,(int *)&local_c8);
  local_c0 = (undefined1  [8])iVar4.node;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_b8._4_4_,iVar4.position);
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>>
            ((internal *)local_b0,"res.position","other.find(3)",
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)local_88,
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)local_c0);
  if (local_b0[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (pbStack_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (pbStack_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a8,pbStack_a8);
  }
  local_c0 = (undefined1  [8])(CONCAT71(local_c0._1_7_,local_78[0]) ^ 1);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_78[0] != false) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)local_c0,(AssertionResult *)"res.inserted","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72e,(char *)_local_b0);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b0 != &local_a0) {
      operator_delete(_local_b0,
                      CONCAT26(local_a0._M_allocated_capacity._6_2_,
                               CONCAT15(local_a0._M_local_buf[5],
                                        CONCAT41(local_a0._M_allocated_capacity._1_4_,
                                                 local_a0._M_local_buf[0]))) + 1);
    }
    if ((long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) + 8))();
    }
  }
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
  auVar1 = local_c0;
  local_c0[0] = local_73;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_73 == false) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_b8;
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)local_c0,(AssertionResult *)"res.node.empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72f,(char *)_local_b0);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b0 != &local_a0) {
      operator_delete(_local_b0,
                      CONCAT26(local_a0._M_allocated_capacity._6_2_,
                               CONCAT15(local_a0._M_local_buf[5],
                                        CONCAT41(local_a0._M_allocated_capacity._1_4_,
                                                 local_a0._M_local_buf[0]))) + 1);
    }
    if ((long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) + 8))();
    }
    __ptr_00 = local_b8;
    if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001c0fa3;
  }
  else {
    if (local_73 == false) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xb09,
                    "slot_type *phmap::priv::node_handle_base<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>, std::allocator<int>>::slot() const [PolicyTraits = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>, Alloc = std::allocator<int>]"
                   );
    }
    local_c0._4_4_ = auVar1._4_4_;
    local_c0._0_4_ = 3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_b0,"res.node.value()","3",(int *)local_70,(int *)local_c0);
    if (local_b0[0] == (key_compare)0x0) {
      testing::Message::Message((Message *)local_c0);
      if (pbStack_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (pbStack_a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x730,message);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
    }
    if (pbStack_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001c0fa3;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_a8;
    __ptr_00 = pbStack_a8;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_001c0fa3:
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::~btree
            ((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              *)local_60);
  if (local_73 == true) {
    local_73 = false;
  }
  if (local_73 == true) {
    local_73 = false;
  }
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::~btree
            (&local_40);
  if (local_90.
      super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == true) {
    local_90.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
  }
  if (local_90.
      super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == true) {
    local_90.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
  }
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::~btree
            (&local_28);
  return;
}

Assistant:

TEST(Btree, ExtractAndInsertNodeHandleSet) {
        phmap::btree_set<int> src1 = {1, 2, 3, 4, 5};
        auto nh = src1.extract(src1.find(3));
        EXPECT_THAT(src1, ElementsAre(1, 2, 4, 5));
        phmap::btree_set<int> other;
        phmap::btree_set<int>::insert_return_type res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3));
        EXPECT_EQ(res.position, other.find(3));
        EXPECT_TRUE(res.inserted);
        EXPECT_TRUE(res.node.empty());

        phmap::btree_set<int> src2 = {3, 4};
        nh = src2.extract(src2.find(3));
        EXPECT_THAT(src2, ElementsAre(4));
        res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3));
        EXPECT_EQ(res.position, other.find(3));
        EXPECT_FALSE(res.inserted);
        ASSERT_FALSE(res.node.empty());
        EXPECT_EQ(res.node.value(), 3);
    }